

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::DeleteNode(BpTree<int> *this,IndexNode<int> *Node)

{
  int *__x;
  bool bVar1;
  int iVar2;
  Block B;
  string sStack_2068;
  Block local_2048;
  
  __x = &(Node->self).FileOff;
  std::vector<int,_std::allocator<int>_>::push_back(&this->FileOff_bin,__x);
  Block::Block(&local_2048,blocks.buffer + (Node->self).BlockNum);
  if ((Node->self).FileOff == local_2048.FileOff) {
    bVar1 = std::operator!=(&this->Index_FileName,&local_2048.FileName);
    if (!bVar1) goto LAB_0013179f;
  }
  std::__cxx11::string::string((string *)&sStack_2068,(string *)&this->Index_FileName);
  iVar2 = Buffer::Allocate(&blocks,&sStack_2068,*__x);
  (Node->self).BlockNum = iVar2;
  std::__cxx11::string::~string((string *)&sStack_2068);
LAB_0013179f:
  Buffer::Free(&blocks,(Node->self).BlockNum);
  std::__cxx11::string::~string((string *)&local_2048);
  return;
}

Assistant:

void BpTree<K>::DeleteNode(IndexNode<K> &Node) {
	this->FileOff_bin.push_back(Node.self.FileOff);
	Block B = blocks.buffer[Node.self.BlockNum];
	if (Node.self.FileOff != B.FileOff || this->Index_FileName != B.FileName) {
		//�����һ���Ѿ�������ռ�죬��Ҫ����µ�һ��
		Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);
	}
	blocks.Free(Node.self.BlockNum);
}